

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateValueFunctionWrapper
          (ExpressionContext *ctx,SynBase *source,SynBase *synValue,ExprBase *exprValue,
          InplaceStr functionName)

{
  uint uVar1;
  Allocator *pAVar2;
  ExprBase **ppEVar3;
  ExprBase *pEVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  TypeBase *pTVar7;
  TypeRef *contextType;
  undefined4 extraout_var_00;
  TypeBase **ppTVar8;
  TypeFunction *pTVar9;
  FunctionData *this;
  SynBase *pSVar10;
  ExprVariableDefinition *pEVar11;
  ExprBase *pEVar12;
  undefined4 extraout_var_02;
  VariableData *context;
  ExprVariableDefinition *first;
  ExprBase *pEVar13;
  undefined4 extraout_var_04;
  ExprFunctionAccess *this_00;
  long lVar14;
  char *pcVar15;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_00;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  IntrusiveList<ExprBase> local_688;
  SynBase *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  SmallArray<ArgumentData,_32U> local_648;
  SynIdentifier *name;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  bVar5 = AssertValueExpression(ctx,source,exprValue);
  if (bVar5) {
    pAVar2 = ctx->allocator;
    lVar14 = 0x20;
    do {
      *(undefined8 *)((long)&local_658 + lVar14) = 0;
      *(undefined1 *)((long)&uStack_650 + lVar14) = 0;
      *(undefined8 *)((long)local_648.little + lVar14 + -0x10) = 0;
      *(undefined8 *)((long)local_648.little + lVar14 + -8) = 0;
      *(undefined8 *)((long)&local_648.little[0].source + lVar14) = 0;
      *(undefined8 *)(&local_648.little[0].isExplicit + lVar14) = 0;
      lVar14 = lVar14 + 0x30;
    } while (lVar14 != 0x620);
    local_648.data = local_648.little;
    local_648.count = 0;
    local_648.max = 0x20;
    local_648.allocator = pAVar2;
    if ((ctx->scope == ctx->globalScope) || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) {
      pTVar7 = ctx->typeVoid;
    }
    else {
      pTVar7 = CreateFunctionContextType(ctx,source,functionName);
    }
    contextType = ExpressionContext::GetReferenceType(ctx,pTVar7);
    local_670 = synValue;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name = (SynIdentifier *)CONCAT44(extraout_var_00,iVar6);
    SynBase::SynBase((SynBase *)name,4,source->begin,source->end);
    (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
    (name->name).begin = functionName.begin;
    ppTVar8 = &exprValue->type;
    if (exprValue == (ExprBase *)0x0) {
      ppTVar8 = &ctx->typeAuto;
    }
    (name->name).end = functionName.end;
    arguments_00.count = local_648.count;
    arguments_00.data = local_648.data;
    arguments_00._12_4_ = 0;
    pTVar9 = ExpressionContext::GetFunctionType(ctx,source,*ppTVar8,arguments_00);
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
    this = (FunctionData *)CONCAT44(extraout_var_01,iVar6);
    local_668 = 0;
    uStack_660 = 0;
    uVar1 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar1 + 1;
    pcVar15 = (char *)0x0;
    FunctionData::FunctionData
              (this,ctx->allocator,source,ctx->scope,false,false,false,pTVar9,
               &contextType->super_TypeBase,name,(IntrusiveList<MatchData>)ZEXT816(0),uVar1);
    name_00.end = pcVar15;
    name_00.begin = (this->name->name).end;
    anon_unknown.dwarf_9fd58::CheckFunctionConflict
              ((anon_unknown_dwarf_9fd58 *)ctx,(ExpressionContext *)source,
               (SynBase *)(this->name->name).begin,name_00);
    ExpressionContext::AddFunction(ctx,this);
    ExpressionContext::PushScope(ctx,this);
    this->functionScope = ctx->scope;
    pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar11 = CreateFunctionContextArgument(ctx,pSVar10,this);
    this->argumentsSize = this->functionScope->dataSize;
    local_688.head = (ExprBase *)0x0;
    local_688.tail = (ExprBase *)0x0;
    if (local_670 == (SynBase *)0x0) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar12 = (ExprBase *)CONCAT44(extraout_var_02,iVar6);
      pTVar7 = ctx->typeVoid;
      pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pSVar10 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar10,this,ctx->scope);
      pEVar12->typeID = 0x1c;
      pEVar12->source = source;
      pEVar12->type = pTVar7;
      pEVar12->next = (ExprBase *)0x0;
      pEVar12->listed = false;
      pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229b70;
      pEVar12[1]._vptr_ExprBase = (_func_int **)exprValue;
      *(undefined8 *)&pEVar12[1].typeID = 0;
      pEVar12[1].source = pSVar10;
    }
    else {
      pEVar12 = AnalyzeExpression(ctx,local_670);
      pEVar12 = CreateReturn(ctx,source,pEVar12);
    }
    IntrusiveList<ExprBase>::push_back(&local_688,pEVar12);
    ClosePendingUpvalues(ctx,this);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
    if ((ctx->scope == ctx->globalScope) || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) {
      context = (VariableData *)0x0;
      first = (ExprVariableDefinition *)0x0;
    }
    else {
      context = CreateFunctionContextVariable(ctx,source,this,(FunctionData *)0x0);
      first = CreateFunctionContextVariableDefinition(ctx,source,this,(FunctionData *)0x0,context);
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
    pTVar9 = this->type;
    local_658 = local_688.head;
    pEVar12 = local_658;
    uStack_650 = local_688.tail;
    pEVar4 = uStack_650;
    pEVar13->typeID = 0x24;
    pEVar13->source = source;
    pEVar13->type = &pTVar9->super_TypeBase;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229ba8;
    pEVar13[1]._vptr_ExprBase = (_func_int **)this;
    *(ExprVariableDefinition **)&pEVar13[1].typeID = pEVar11;
    pEVar13[1].source = (SynBase *)0x0;
    pEVar13[1].type = (TypeBase *)0x0;
    pEVar13[1].next = (ExprBase *)0x0;
    local_658._0_4_ = SUB84(local_688.head,0);
    local_658._4_4_ = (undefined4)((ulong)local_688.head >> 0x20);
    uStack_650._0_4_ = SUB84(local_688.tail,0);
    uStack_650._4_4_ = (undefined4)((ulong)local_688.tail >> 0x20);
    *(undefined4 *)&pEVar13[1].listed = (undefined4)local_658;
    *(undefined4 *)&pEVar13[1].field_0x2c = local_658._4_4_;
    *(undefined4 *)&pEVar13[2]._vptr_ExprBase = (undefined4)uStack_650;
    *(undefined4 *)((long)&pEVar13[2]._vptr_ExprBase + 4) = uStack_650._4_4_;
    *(ExprVariableDefinition **)&pEVar13[2].typeID = first;
    pEVar13[2].source = (SynBase *)context;
    this->declaration = pEVar13;
    uVar1 = (ctx->definitions).count;
    local_658 = pEVar12;
    uStack_650 = pEVar4;
    if (uVar1 == (ctx->definitions).max) {
      SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar1);
    }
    ppEVar3 = (ctx->definitions).data;
    if (ppEVar3 == (ExprBase **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]"
                   );
    }
    pEVar12 = this->declaration;
    uVar1 = (ctx->definitions).count;
    (ctx->definitions).count = uVar1 + 1;
    ppEVar3[uVar1] = pEVar12;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this_00 = (ExprFunctionAccess *)CONCAT44(extraout_var_04,iVar6);
    pTVar9 = this->type;
    pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar12 = CreateFunctionContextAccess(ctx,pSVar10,this);
    ExprFunctionAccess::ExprFunctionAccess(this_00,source,&pTVar9->super_TypeBase,this,pEVar12);
    if (first != (ExprVariableDefinition *)0x0) {
      this_00 = (ExprFunctionAccess *)
                CreateSequence(ctx,source,&first->super_ExprBase,(ExprBase *)this_00);
    }
    SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
  }
  else {
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this_00 = (ExprFunctionAccess *)CONCAT44(extraout_var,iVar6);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    (this_00->super_ExprBase).typeID = 0;
    (this_00->super_ExprBase).source = source;
    (this_00->super_ExprBase).type = pTVar7;
    (this_00->super_ExprBase).next = (ExprBase *)0x0;
    (this_00->super_ExprBase).listed = false;
    (this_00->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00229b38;
    this_00[1].super_ExprBase.next = (ExprBase *)0x0;
    this_00->function = (FunctionData *)(this_00 + 1);
    this_00->context = (ExprBase *)0x400000001;
    this_00[1].super_ExprBase._vptr_ExprBase = (_func_int **)exprValue;
  }
  return &this_00->super_ExprBase;
}

Assistant:

ExprBase* CreateValueFunctionWrapper(ExpressionContext &ctx, SynBase *source, SynBase *synValue, ExprBase *exprValue, InplaceStr functionName)
{
	if(!AssertValueExpression(ctx, source, exprValue))
		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType(), exprValue);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextRefType = NULL;

	if(ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace)
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(source->begin, source->end, functionName);

	TypeFunction *typeFunction = ctx.GetFunctionType(source, exprValue ? exprValue->type : ctx.typeAuto, arguments);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, typeFunction, contextRefType, functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	IntrusiveList<ExprBase> expressions;

	if (synValue)
		expressions.push_back(CreateReturn(ctx, source, AnalyzeExpression(ctx, synValue)));
	else
		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, exprValue, NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(ctx.scope != ctx.globalScope && !ctx.scope->ownerNamespace)
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, function->type, function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), function));

	if(!contextVariableDefinition)
		return access;

	return CreateSequence(ctx, source, contextVariableDefinition, access);
}